

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResultCollector.cpp
# Opt level: O2

void __thiscall CppUnit::TestResultCollector::reset(TestResultCollector *this)

{
  ExclusiveZone local_20;
  ExclusiveZone zone;
  
  TestSuccessListener::reset(&this->super_TestSuccessListener);
  local_20.m_syncObject = (this->super_TestSuccessListener).super_SynchronizedObject.m_syncObject;
  (*(local_20.m_syncObject)->_vptr_SynchronizationObject[2])();
  freeFailures(this);
  this->m_testErrors = 0;
  std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::clear(&this->m_tests);
  SynchronizedObject::ExclusiveZone::~ExclusiveZone(&local_20);
  return;
}

Assistant:

void 
TestResultCollector::reset()
{
  TestSuccessListener::reset();

  ExclusiveZone zone( m_syncObject ); 
  freeFailures();
  m_testErrors = 0;
  m_tests.clear();
}